

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeGetIntegratorStats
              (void *cvode_mem,long *nsteps,long *nfevals,long *nlinsetups,long *netfails,int *qlast
              ,int *qcur,sunrealtype *hinused,sunrealtype *hlast,sunrealtype *hcur,sunrealtype *tcur
              )

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x5ab,"CVodeGetIntegratorStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x358);
    *in_RDX = *(undefined8 *)(in_RDI + 0x360);
    *in_RCX = *(undefined8 *)(in_RDI + 0x388);
    *in_R8 = *(undefined8 *)(in_RDI + 0x380);
    *in_R9 = *(undefined4 *)(in_RDI + 0x428);
    *(undefined4 *)&cv_mem->cv_sunctx = *(undefined4 *)(in_RDI + 0x128);
    *(undefined8 *)qlast = *(undefined8 *)(in_RDI + 0x438);
    *netfails = *(long *)(in_RDI + 0x440);
    *nlinsetups = *(long *)(in_RDI + 0x150);
    *nfevals = *(long *)(in_RDI + 0x168);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetIntegratorStats(void* cvode_mem, long int* nsteps, long int* nfevals,
                            long int* nlinsetups, long int* netfails, int* qlast,
                            int* qcur, sunrealtype* hinused, sunrealtype* hlast,
                            sunrealtype* hcur, sunrealtype* tcur)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *nsteps     = cv_mem->cv_nst;
  *nfevals    = cv_mem->cv_nfe;
  *nlinsetups = cv_mem->cv_nsetups;
  *netfails   = cv_mem->cv_netf;
  *qlast      = cv_mem->cv_qu;
  *qcur       = cv_mem->cv_next_q;
  *hinused    = cv_mem->cv_h0u;
  *hlast      = cv_mem->cv_hu;
  *hcur       = cv_mem->cv_next_h;
  *tcur       = cv_mem->cv_tn;

  return (CV_SUCCESS);
}